

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# form.cpp
# Opt level: O3

bool __thiscall cppcms::widgets::select_multiple::validate(select_multiple *this)

{
  pointer peVar1;
  bool bVar2;
  uint uVar3;
  long lVar4;
  ulong uVar5;
  uint uVar6;
  ulong uVar7;
  
  peVar1 = (this->elements_).
           super__Vector_base<cppcms::widgets::select_multiple::element,_std::allocator<cppcms::widgets::select_multiple::element>_>
           ._M_impl.super__Vector_impl_data._M_start;
  lVar4 = (long)(this->elements_).
                super__Vector_base<cppcms::widgets::select_multiple::element,_std::allocator<cppcms::widgets::select_multiple::element>_>
                ._M_impl.super__Vector_impl_data._M_finish - (long)peVar1;
  if (lVar4 == 0) {
    uVar3 = 0;
  }
  else {
    uVar5 = (lVar4 >> 3) * -0x70a3d70a3d70a3d7;
    uVar3 = 0;
    uVar6 = 1;
    do {
      uVar3 = uVar3 + (*(uint *)peVar1 & 1);
      uVar7 = (ulong)uVar6;
      peVar1 = peVar1 + 1;
      uVar6 = uVar6 + 1;
    } while (uVar7 <= uVar5 && uVar5 - uVar7 != 0);
  }
  bVar2 = uVar3 <= this->high_ && this->low_ <= uVar3;
  *(uint *)&(this->super_base_widget).field_0x1f0 =
       *(uint *)&(this->super_base_widget).field_0x1f0 & 0xfffffffe | (uint)bVar2;
  return bVar2;
}

Assistant:

bool select_multiple::validate()
{
	unsigned count=0;
	for(unsigned i=0;i<elements_.size();i++)
		count += elements_[i].selected;
	if(low_ <= count && count <= high_) {
		valid(true);
		return true;
	}
	else {
		valid(false);
		return false;
	}
}